

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcAnalyzer::HdlcBytesToVectorBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *asyncBytes)

{
  pointer pHVar1;
  uint uVar2;
  ulong uVar3;
  U8 local_29;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    pHVar1 = (asyncBytes->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(asyncBytes->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl
                       .super__Vector_impl_data._M_finish - (long)pHVar1) / 0x18) <= uVar3) break;
    if (pHVar1[uVar3].escaped == true) {
      local_29 = HdlcAnalyzerSettings::Bit5Inv(pHVar1[uVar3].value);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_29);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&pHVar1[uVar3].value);
    }
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcAnalyzer::HdlcBytesToVectorBytes( const vector<HdlcByte>& asyncBytes ) const
{
    vector<U8> ret;
    for( U32 i = 0; i < asyncBytes.size(); ++i )
    {
        if( asyncBytes[ i ].escaped )
            ret.push_back( HdlcAnalyzerSettings::Bit5Inv( asyncBytes[ i ].value ) );
        else
            ret.push_back( asyncBytes[ i ].value );
    }
    return ret;
}